

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmse.cc
# Opt level: O0

int main(int argc,char **argv)

{
  double dVar1;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  char *pcVar2;
  double dVar3;
  bool bVar4;
  byte bVar5;
  _Ios_Openmode _Var6;
  ostream *poVar7;
  reference pvVar8;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_15;
  ostringstream error_message_14;
  vector<double,_std::allocator<double>_> mean;
  ostringstream error_message_13;
  double root_mean_squared_error_1;
  ostringstream error_message_12;
  vector<double,_std::allocator<double>_> mean_squared_error_1;
  ostringstream error_message_11;
  ostringstream error_message_10;
  double root_mean_squared_error;
  ostringstream error_message_9;
  vector<double,_std::allocator<double>_> mean_squared_error;
  ostringstream error_message_8;
  double error;
  int i;
  vector<double,_std::allocator<double>_> data2;
  vector<double,_std::allocator<double>_> data1;
  int read_size;
  ostringstream error_message_7;
  Buffer buffer_for_mean;
  Buffer buffer_for_mean_squared_error;
  StatisticsAccumulation accumulation;
  istream *input_stream2;
  ostringstream error_message_6;
  ifstream ifs2;
  istream *input_stream1;
  ostringstream error_message_5;
  ifstream ifs1;
  ostringstream error_message_4;
  ostringstream error_message_3;
  int num_input_files;
  char *input_file2;
  char *input_file1;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  option long_options [2];
  bool output_frame_by_frame;
  bool use_magic_number;
  double magic_number;
  int vector_length;
  option *in_stack_ffffffffffffdc88;
  Buffer *buffer;
  Buffer *in_stack_ffffffffffffdc90;
  undefined7 in_stack_ffffffffffffdc98;
  undefined1 in_stack_ffffffffffffdc9f;
  Buffer *in_stack_ffffffffffffdca0;
  undefined7 in_stack_ffffffffffffdca8;
  undefined1 in_stack_ffffffffffffdcaf;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffdcb0;
  vector<double,_std::allocator<double>_> *pvVar9;
  allocator_type *in_stack_ffffffffffffdcb8;
  allocator *paVar10;
  undefined7 in_stack_ffffffffffffdcc0;
  undefined1 in_stack_ffffffffffffdcc7;
  istream *in_stack_ffffffffffffdcc8;
  undefined7 in_stack_ffffffffffffdcd0;
  undefined1 in_stack_ffffffffffffdcd7;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffdcd8;
  Buffer *in_stack_ffffffffffffdce0;
  undefined6 in_stack_ffffffffffffdce8;
  byte in_stack_ffffffffffffdcee;
  undefined1 in_stack_ffffffffffffdcef;
  int *in_stack_ffffffffffffdcf0;
  bool local_22aa;
  int local_2284;
  char *local_2270;
  undefined4 in_stack_ffffffffffffdde8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffddf0;
  StatisticsAccumulation *in_stack_ffffffffffffddf8;
  ostringstream *this;
  bool local_21aa;
  undefined5 in_stack_ffffffffffffde78;
  byte in_stack_ffffffffffffde7d;
  undefined1 in_stack_ffffffffffffde7e;
  undefined1 in_stack_ffffffffffffde7f;
  string *in_stack_ffffffffffffde80;
  undefined1 local_2169 [33];
  ostringstream local_2148 [383];
  undefined1 local_1fc9 [33];
  ostringstream local_1fa8 [383];
  undefined1 local_1e29 [32];
  allocator local_1e09;
  string local_1e08 [32];
  ostringstream local_1de8 [376];
  double local_1c70;
  allocator local_1c61;
  string local_1c60 [32];
  ostringstream local_1c40 [383];
  undefined1 local_1ac1 [32];
  undefined1 local_1aa1 [33];
  ostringstream local_1a80 [383];
  undefined1 local_1901;
  double local_1900;
  double *local_18f8;
  undefined8 local_18f0;
  allocator local_18c9;
  string local_18c8 [32];
  ostringstream local_18a8 [376];
  double local_1730;
  allocator local_1721;
  string local_1720 [32];
  ostringstream local_1700 [384];
  vector<double,_std::allocator<double>_> local_1580;
  allocator local_1561;
  string local_1560 [32];
  ostringstream local_1540 [384];
  double local_13c0;
  double *local_13b8;
  undefined8 local_13b0;
  double local_1390;
  int local_1388;
  vector<double,_std::allocator<double>_> local_1380;
  vector<double,_std::allocator<double>_> local_1360;
  int local_1348;
  allocator local_1341;
  string local_1340 [32];
  ostringstream local_1320 [632];
  StatisticsAccumulation local_10a8;
  char *local_1090;
  allocator local_1081;
  string local_1080 [32];
  ostringstream local_1060 [376];
  char local_ee8 [520];
  char *local_ce0;
  int local_cd8;
  allocator local_cd1;
  string local_cd0 [32];
  ostringstream local_cb0 [376];
  char local_b38 [527];
  allocator local_929;
  string local_928 [32];
  ostringstream local_908 [383];
  allocator local_789;
  string local_788 [32];
  ostringstream local_768 [380];
  int local_5ec;
  char *local_5e8;
  char *local_5e0;
  allocator local_5d1;
  string local_5d0 [32];
  ostringstream local_5b0 [383];
  allocator local_431;
  string local_430 [39];
  allocator local_409;
  string local_408 [32];
  ostringstream local_3e8 [383];
  allocator local_269;
  string local_268 [39];
  allocator local_241;
  string local_240 [32];
  ostringstream local_220 [399];
  allocator local_91;
  string local_90 [36];
  int local_6c;
  undefined1 local_68 [70];
  byte local_22;
  byte local_21;
  double local_20;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = -1;
  local_20 = 0.0;
  local_21 = 0;
  local_22 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  memcpy(local_68,&PTR_anon_var_dwarf_21c2_0012ac40,0x40);
  while (local_6c = ya_getopt_long_only((int)((ulong)in_stack_ffffffffffffdca0 >> 0x20),
                                        (char **)CONCAT17(in_stack_ffffffffffffdc9f,
                                                          in_stack_ffffffffffffdc98),
                                        (char *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88,
                                        (int *)0x103739), pcVar2 = ya_optarg, local_6c != -1) {
    if (local_6c == 0x66) {
      local_22 = 1;
    }
    else {
      if (local_6c == 0x68) {
        anon_unknown.dwarf_216e::PrintUsage
                  ((ostream *)CONCAT17(in_stack_ffffffffffffdcc7,in_stack_ffffffffffffdcc0));
        return 0;
      }
      if (local_6c == 0x6c) {
        in_stack_ffffffffffffde80 = (string *)ya_optarg;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_90,(char *)in_stack_ffffffffffffde80,&local_91);
        in_stack_ffffffffffffde7f =
             sptk::ConvertStringToInteger
                       ((string *)CONCAT17(in_stack_ffffffffffffdc9f,in_stack_ffffffffffffdc98),
                        (int *)in_stack_ffffffffffffdc90);
        in_stack_ffffffffffffde7d = !(bool)in_stack_ffffffffffffde7f || local_14 < 1;
        in_stack_ffffffffffffde7e = in_stack_ffffffffffffde7d;
        std::__cxx11::string::~string(local_90);
        std::allocator<char>::~allocator((allocator<char> *)&local_91);
        if ((in_stack_ffffffffffffde7d & 1) != 0) {
          std::__cxx11::ostringstream::ostringstream(local_220);
          std::operator<<((ostream *)local_220,
                          "The argument for the -l option must be a positive integer");
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_240,"rmse",&local_241);
          sptk::PrintErrorMessage
                    (in_stack_ffffffffffffde80,
                     (ostringstream *)
                     CONCAT17(in_stack_ffffffffffffde7f,
                              CONCAT16(in_stack_ffffffffffffde7e,
                                       CONCAT15(in_stack_ffffffffffffde7d,in_stack_ffffffffffffde78)
                                      )));
          std::__cxx11::string::~string(local_240);
          std::allocator<char>::~allocator((allocator<char> *)&local_241);
          local_4 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_220);
          return local_4;
        }
      }
      else if (local_6c == 0x6d) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_268,pcVar2,&local_269);
        bVar4 = sptk::ConvertStringToInteger
                          ((string *)CONCAT17(in_stack_ffffffffffffdc9f,in_stack_ffffffffffffdc98),
                           (int *)in_stack_ffffffffffffdc90);
        local_21aa = !bVar4 || local_14 < 0;
        std::__cxx11::string::~string(local_268);
        std::allocator<char>::~allocator((allocator<char> *)&local_269);
        if (local_21aa) {
          std::__cxx11::ostringstream::ostringstream(local_3e8);
          poVar7 = std::operator<<((ostream *)local_3e8,"The argument for the -m option must be a ")
          ;
          std::operator<<(poVar7,"non-negative integer");
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_408,"rmse",&local_409);
          sptk::PrintErrorMessage
                    (in_stack_ffffffffffffde80,
                     (ostringstream *)
                     CONCAT17(in_stack_ffffffffffffde7f,
                              CONCAT16(in_stack_ffffffffffffde7e,
                                       CONCAT15(in_stack_ffffffffffffde7d,in_stack_ffffffffffffde78)
                                      )));
          std::__cxx11::string::~string(local_408);
          std::allocator<char>::~allocator((allocator<char> *)&local_409);
          local_4 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_3e8);
          return local_4;
        }
        local_14 = local_14 + 1;
      }
      else {
        if (local_6c != 1000) {
          anon_unknown.dwarf_216e::PrintUsage
                    ((ostream *)CONCAT17(in_stack_ffffffffffffdcc7,in_stack_ffffffffffffdcc0));
          return 1;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_430,pcVar2,&local_431);
        bVar4 = sptk::ConvertStringToDouble
                          ((string *)CONCAT17(in_stack_ffffffffffffdc9f,in_stack_ffffffffffffdc98),
                           (double *)in_stack_ffffffffffffdc90);
        std::__cxx11::string::~string(local_430);
        std::allocator<char>::~allocator((allocator<char> *)&local_431);
        if (((bVar4 ^ 0xffU) & 1) != 0) {
          std::__cxx11::ostringstream::ostringstream(local_5b0);
          std::operator<<((ostream *)local_5b0,"The argument for the -magic option must be numeric")
          ;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_5d0,"rmse",&local_5d1);
          sptk::PrintErrorMessage
                    (in_stack_ffffffffffffde80,
                     (ostringstream *)
                     CONCAT17(in_stack_ffffffffffffde7f,
                              CONCAT16(in_stack_ffffffffffffde7e,
                                       CONCAT15(in_stack_ffffffffffffde7d,in_stack_ffffffffffffde78)
                                      )));
          std::__cxx11::string::~string(local_5d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
          local_4 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_5b0);
          return local_4;
        }
        local_21 = 1;
      }
    }
  }
  local_5e0 = (char *)0x0;
  local_5e8 = (char *)0x0;
  local_5ec = local_8 - ya_optind;
  if (local_5ec == 2) {
    local_5e0 = *(char **)(local_10 + (long)(local_8 + -2) * 8);
    local_5e8 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
  }
  else {
    if (local_5ec != 1) {
      std::__cxx11::ostringstream::ostringstream(local_768);
      std::operator<<((ostream *)local_768,"Just two input files, file1, and infile, are required");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_788,"rmse",&local_789);
      sptk::PrintErrorMessage
                (in_stack_ffffffffffffde80,
                 (ostringstream *)
                 CONCAT17(in_stack_ffffffffffffde7f,
                          CONCAT16(in_stack_ffffffffffffde7e,
                                   CONCAT15(in_stack_ffffffffffffde7d,in_stack_ffffffffffffde78))));
      std::__cxx11::string::~string(local_788);
      std::allocator<char>::~allocator((allocator<char> *)&local_789);
      local_4 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_768);
      return local_4;
    }
    local_5e0 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
    local_5e8 = (char *)0x0;
  }
  bVar4 = sptk::SetBinaryMode();
  if (!bVar4) {
    this = local_908;
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,"Cannot set translation mode");
    paVar10 = &local_929;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_928,"rmse",paVar10);
    sptk::PrintErrorMessage
              (in_stack_ffffffffffffde80,
               (ostringstream *)
               CONCAT17(in_stack_ffffffffffffde7f,
                        CONCAT16(in_stack_ffffffffffffde7e,
                                 CONCAT15(in_stack_ffffffffffffde7d,in_stack_ffffffffffffde78))));
    std::__cxx11::string::~string(local_928);
    std::allocator<char>::~allocator((allocator<char> *)&local_929);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_908);
    return local_4;
  }
  std::ifstream::ifstream(local_b38);
  pcVar2 = local_5e0;
  _Var6 = std::operator|(_S_in,_S_bin);
  std::ifstream::open(local_b38,(_Ios_Openmode)pcVar2);
  bVar5 = std::ios::fail();
  if ((bVar5 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_cb0);
    poVar7 = std::operator<<((ostream *)local_cb0,"Cannot open file ");
    std::operator<<(poVar7,local_5e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_cd0,"rmse",&local_cd1);
    sptk::PrintErrorMessage
              (in_stack_ffffffffffffde80,
               (ostringstream *)
               CONCAT17(in_stack_ffffffffffffde7f,
                        CONCAT16(in_stack_ffffffffffffde7e,
                                 CONCAT15(in_stack_ffffffffffffde7d,in_stack_ffffffffffffde78))));
    std::__cxx11::string::~string(local_cd0);
    std::allocator<char>::~allocator((allocator<char> *)&local_cd1);
    local_4 = 1;
    local_cd8 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_cb0);
    goto LAB_001059e7;
  }
  local_ce0 = local_b38;
  std::ifstream::ifstream(local_ee8);
  pcVar2 = local_5e8;
  if (local_5e8 == (char *)0x0) {
LAB_00104565:
    bVar5 = std::ifstream::is_open();
    if ((bVar5 & 1) == 0) {
      local_2270 = (char *)&std::cin;
    }
    else {
      local_2270 = local_ee8;
    }
    local_1090 = local_2270;
    sptk::StatisticsAccumulation::StatisticsAccumulation(&local_10a8,0,1,false,false);
    sptk::StatisticsAccumulation::Buffer::Buffer(in_stack_ffffffffffffdca0);
    sptk::StatisticsAccumulation::Buffer::Buffer(in_stack_ffffffffffffdca0);
    bVar4 = sptk::StatisticsAccumulation::IsValid(&local_10a8);
    if (bVar4) {
      if (local_14 == -1) {
        local_2284 = 1;
      }
      else {
        local_2284 = local_14;
      }
      local_1348 = local_2284;
      std::allocator<double>::allocator((allocator<double> *)0x1047e2);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_ffffffffffffdcb0,
                 CONCAT17(in_stack_ffffffffffffdcaf,in_stack_ffffffffffffdca8),
                 (allocator_type *)in_stack_ffffffffffffdca0);
      std::allocator<double>::~allocator((allocator<double> *)0x10480e);
      std::allocator<double>::allocator((allocator<double> *)0x104833);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_ffffffffffffdcb0,
                 CONCAT17(in_stack_ffffffffffffdcaf,in_stack_ffffffffffffdca8),
                 (allocator_type *)in_stack_ffffffffffffdca0);
      std::allocator<double>::~allocator((allocator<double> *)0x10485f);
      do {
        do {
          buffer = (Buffer *)0x0;
          bVar4 = sptk::ReadStream<double>
                            (SUB81((ulong)in_stack_ffffffffffffdce0 >> 0x30,0),
                             (int)in_stack_ffffffffffffdce0,
                             (int)((ulong)in_stack_ffffffffffffdcd8 >> 0x20),
                             (int)in_stack_ffffffffffffdcd8,
                             (vector<double,_std::allocator<double>_> *)
                             CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                             in_stack_ffffffffffffdcc8,in_stack_ffffffffffffdcf0);
          local_22aa = false;
          if (bVar4) {
            buffer = (Buffer *)0x0;
            local_22aa = sptk::ReadStream<double>
                                   (SUB81((ulong)in_stack_ffffffffffffdce0 >> 0x30,0),
                                    (int)in_stack_ffffffffffffdce0,
                                    (int)((ulong)in_stack_ffffffffffffdcd8 >> 0x20),
                                    (int)in_stack_ffffffffffffdcd8,
                                    (vector<double,_std::allocator<double>_> *)
                                    CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                                    in_stack_ffffffffffffdcc8,in_stack_ffffffffffffdcf0);
          }
          if (local_22aa == false) {
            if (local_14 == -1) {
              pvVar9 = (vector<double,_std::allocator<double>_> *)local_1ac1;
              std::allocator<double>::allocator((allocator<double> *)0x105294);
              std::vector<double,_std::allocator<double>_>::vector
                        (in_stack_ffffffffffffdcb0,
                         CONCAT17(in_stack_ffffffffffffdcaf,in_stack_ffffffffffffdca8),
                         (allocator_type *)in_stack_ffffffffffffdca0);
              std::allocator<double>::~allocator((allocator<double> *)0x1052ba);
              bVar4 = sptk::StatisticsAccumulation::GetMean
                                ((StatisticsAccumulation *)
                                 CONCAT17(in_stack_ffffffffffffdcef,
                                          CONCAT16(in_stack_ffffffffffffdcee,
                                                   in_stack_ffffffffffffdce8)),
                                 in_stack_ffffffffffffdce0,pvVar9);
              if (bVar4) {
                pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(local_1ac1 + 1),0);
                local_1c70 = sqrt(*pvVar8);
                bVar4 = sptk::WriteStream<double>((double)buffer,(ostream *)0x105479);
                if (bVar4) {
                  local_cd8 = 0;
                }
                else {
                  std::__cxx11::ostringstream::ostringstream(local_1de8);
                  std::operator<<((ostream *)local_1de8,"Failed to write root mean squared error");
                  paVar10 = &local_1e09;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_1e08,"rmse",paVar10);
                  sptk::PrintErrorMessage
                            (in_stack_ffffffffffffde80,
                             (ostringstream *)
                             CONCAT17(in_stack_ffffffffffffde7f,
                                      CONCAT16(in_stack_ffffffffffffde7e,
                                               CONCAT15(in_stack_ffffffffffffde7d,
                                                        in_stack_ffffffffffffde78))));
                  std::__cxx11::string::~string(local_1e08);
                  std::allocator<char>::~allocator((allocator<char> *)&local_1e09);
                  local_4 = 1;
                  local_cd8 = 1;
                  std::__cxx11::ostringstream::~ostringstream(local_1de8);
                }
              }
              else {
                std::__cxx11::ostringstream::ostringstream(local_1c40);
                std::operator<<((ostream *)local_1c40,"Failed to get mean squared error");
                paVar10 = &local_1c61;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_1c60,"rmse",paVar10);
                sptk::PrintErrorMessage
                          (in_stack_ffffffffffffde80,
                           (ostringstream *)
                           CONCAT17(in_stack_ffffffffffffde7f,
                                    CONCAT16(in_stack_ffffffffffffde7e,
                                             CONCAT15(in_stack_ffffffffffffde7d,
                                                      in_stack_ffffffffffffde78))));
                std::__cxx11::string::~string(local_1c60);
                std::allocator<char>::~allocator((allocator<char> *)&local_1c61);
                local_4 = 1;
                local_cd8 = 1;
                std::__cxx11::ostringstream::~ostringstream(local_1c40);
              }
              std::vector<double,_std::allocator<double>_>::~vector
                        ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdca0);
joined_r0x00105912:
              if (local_cd8 != 0) goto LAB_0010593f;
            }
            else if ((local_22 & 1) == 0) {
              pvVar9 = (vector<double,_std::allocator<double>_> *)local_1e29;
              std::allocator<double>::allocator((allocator<double> *)0x1055fe);
              std::vector<double,_std::allocator<double>_>::vector
                        (pvVar9,CONCAT17(in_stack_ffffffffffffdcaf,in_stack_ffffffffffffdca8),
                         (allocator_type *)in_stack_ffffffffffffdca0);
              std::allocator<double>::~allocator((allocator<double> *)0x105624);
              bVar4 = sptk::StatisticsAccumulation::GetMean
                                ((StatisticsAccumulation *)
                                 CONCAT17(in_stack_ffffffffffffdcef,
                                          CONCAT16(in_stack_ffffffffffffdcee,
                                                   in_stack_ffffffffffffdce8)),
                                 in_stack_ffffffffffffdce0,in_stack_ffffffffffffdcd8);
              if (bVar4) {
                std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(local_1e29 + 1),0);
                bVar4 = sptk::WriteStream<double>((double)buffer,(ostream *)0x1057cc);
                if (bVar4) {
                  local_cd8 = 0;
                }
                else {
                  std::__cxx11::ostringstream::ostringstream(local_2148);
                  std::operator<<((ostream *)local_2148,"Failed to write root mean squared error");
                  in_stack_ffffffffffffdc90 = (Buffer *)local_2169;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)(local_2169 + 1),"rmse",
                             (allocator *)in_stack_ffffffffffffdc90);
                  sptk::PrintErrorMessage
                            (in_stack_ffffffffffffde80,
                             (ostringstream *)
                             CONCAT17(in_stack_ffffffffffffde7f,
                                      CONCAT16(in_stack_ffffffffffffde7e,
                                               CONCAT15(in_stack_ffffffffffffde7d,
                                                        in_stack_ffffffffffffde78))));
                  std::__cxx11::string::~string((string *)(local_2169 + 1));
                  std::allocator<char>::~allocator((allocator<char> *)local_2169);
                  local_4 = 1;
                  local_cd8 = 1;
                  std::__cxx11::ostringstream::~ostringstream(local_2148);
                }
              }
              else {
                std::__cxx11::ostringstream::ostringstream(local_1fa8);
                std::operator<<((ostream *)local_1fa8,"Failed to get root mean squared error");
                in_stack_ffffffffffffdca0 = (Buffer *)local_1fc9;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)(local_1fc9 + 1),"rmse",(allocator *)in_stack_ffffffffffffdca0)
                ;
                sptk::PrintErrorMessage
                          (in_stack_ffffffffffffde80,
                           (ostringstream *)
                           CONCAT17(in_stack_ffffffffffffde7f,
                                    CONCAT16(in_stack_ffffffffffffde7e,
                                             CONCAT15(in_stack_ffffffffffffde7d,
                                                      in_stack_ffffffffffffde78))));
                std::__cxx11::string::~string((string *)(local_1fc9 + 1));
                std::allocator<char>::~allocator((allocator<char> *)local_1fc9);
                local_4 = 1;
                local_cd8 = 1;
                std::__cxx11::ostringstream::~ostringstream(local_1fa8);
              }
              std::vector<double,_std::allocator<double>_>::~vector
                        ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdca0);
              goto joined_r0x00105912;
            }
            local_4 = 0;
            local_cd8 = 1;
            goto LAB_0010593f;
          }
          for (local_1388 = 0; dVar1 = local_20, local_1388 < local_1348;
              local_1388 = local_1388 + 1) {
            if ((local_21 & 1) == 0) {
LAB_001049a3:
              pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_1360,(long)local_1388);
              dVar1 = *pvVar8;
              pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_1380,(long)local_1388);
              local_1390 = dVar1 - *pvVar8;
              local_13c0 = local_1390 * local_1390;
              local_13b8 = &local_13c0;
              local_13b0 = 1;
              std::allocator<double>::allocator((allocator<double> *)0x104a3b);
              __l._M_len._0_7_ = in_stack_ffffffffffffdcd0;
              __l._M_array = (iterator)in_stack_ffffffffffffdcc8;
              __l._M_len._7_1_ = in_stack_ffffffffffffdcd7;
              std::vector<double,_std::allocator<double>_>::vector
                        ((vector<double,_std::allocator<double>_> *)
                         CONCAT17(in_stack_ffffffffffffdcc7,in_stack_ffffffffffffdcc0),__l,
                         in_stack_ffffffffffffdcb8);
              bVar4 = sptk::StatisticsAccumulation::Run
                                (in_stack_ffffffffffffddf8,in_stack_ffffffffffffddf0,
                                 (Buffer *)CONCAT44(_Var6,in_stack_ffffffffffffdde8));
              std::vector<double,_std::allocator<double>_>::~vector
                        ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdca0);
              std::allocator<double>::~allocator((allocator<double> *)0x104ab2);
              if (((bVar4 ^ 0xffU) & 1) != 0) {
                std::__cxx11::ostringstream::ostringstream(local_1540);
                std::operator<<((ostream *)local_1540,"Failed to accumulate statistics");
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_1560,"rmse",&local_1561);
                sptk::PrintErrorMessage
                          (in_stack_ffffffffffffde80,
                           (ostringstream *)
                           CONCAT17(in_stack_ffffffffffffde7f,
                                    CONCAT16(in_stack_ffffffffffffde7e,
                                             CONCAT15(in_stack_ffffffffffffde7d,
                                                      in_stack_ffffffffffffde78))));
                std::__cxx11::string::~string(local_1560);
                std::allocator<char>::~allocator((allocator<char> *)&local_1561);
                local_4 = 1;
                local_cd8 = 1;
                std::__cxx11::ostringstream::~ostringstream(local_1540);
                goto LAB_0010593f;
              }
            }
            else {
              pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_1360,(long)local_1388);
              dVar3 = local_20;
              if ((dVar1 != *pvVar8) || (NAN(dVar1) || NAN(*pvVar8))) {
                pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&local_1380,(long)local_1388);
                if ((dVar3 != *pvVar8) || (NAN(dVar3) || NAN(*pvVar8))) goto LAB_001049a3;
              }
            }
          }
        } while (local_14 == -1);
        std::allocator<double>::allocator((allocator<double> *)0x104cce);
        std::vector<double,_std::allocator<double>_>::vector
                  (in_stack_ffffffffffffdcb0,
                   CONCAT17(in_stack_ffffffffffffdcaf,in_stack_ffffffffffffdca8),
                   (allocator_type *)in_stack_ffffffffffffdca0);
        std::allocator<double>::~allocator((allocator<double> *)0x104cf7);
        bVar4 = sptk::StatisticsAccumulation::GetMean
                          ((StatisticsAccumulation *)
                           CONCAT17(in_stack_ffffffffffffdcef,
                                    CONCAT16(in_stack_ffffffffffffdcee,in_stack_ffffffffffffdce8)),
                           in_stack_ffffffffffffdce0,in_stack_ffffffffffffdcd8);
        if (bVar4) {
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_1580,0);
          local_1730 = sqrt(*pvVar8);
          if ((local_22 & 1) == 0) {
            local_18f8 = &local_1900;
            local_18f0 = 1;
            in_stack_ffffffffffffdcf0 = (int *)&local_1901;
            local_1900 = local_1730;
            std::allocator<double>::allocator((allocator<double> *)0x105040);
            __l_00._M_len._0_7_ = in_stack_ffffffffffffdcd0;
            __l_00._M_array = (iterator)in_stack_ffffffffffffdcc8;
            __l_00._M_len._7_1_ = in_stack_ffffffffffffdcd7;
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT17(in_stack_ffffffffffffdcc7,in_stack_ffffffffffffdcc0),__l_00,
                       in_stack_ffffffffffffdcb8);
            in_stack_ffffffffffffdcef =
                 sptk::StatisticsAccumulation::Run
                           (in_stack_ffffffffffffddf8,in_stack_ffffffffffffddf0,
                            (Buffer *)CONCAT44(_Var6,in_stack_ffffffffffffdde8));
            in_stack_ffffffffffffdcee = in_stack_ffffffffffffdcef ^ 0xff;
            std::vector<double,_std::allocator<double>_>::~vector
                      ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdca0);
            std::allocator<double>::~allocator((allocator<double> *)0x1050ab);
            if ((in_stack_ffffffffffffdcee & 1) == 0) goto LAB_00105217;
            std::__cxx11::ostringstream::ostringstream(local_1a80);
            std::operator<<((ostream *)local_1a80,"Failed to accumulate statistics");
            in_stack_ffffffffffffdce0 = (Buffer *)local_1aa1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)(local_1aa1 + 1),"rmse",(allocator *)in_stack_ffffffffffffdce0);
            sptk::PrintErrorMessage
                      (in_stack_ffffffffffffde80,
                       (ostringstream *)
                       CONCAT17(in_stack_ffffffffffffde7f,
                                CONCAT16(in_stack_ffffffffffffde7e,
                                         CONCAT15(in_stack_ffffffffffffde7d,
                                                  in_stack_ffffffffffffde78))));
            std::__cxx11::string::~string((string *)(local_1aa1 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_1aa1);
            local_4 = 1;
            local_cd8 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_1a80);
          }
          else {
            bVar4 = sptk::WriteStream<double>((double)buffer,(ostream *)0x104ed0);
            if (bVar4) {
LAB_00105217:
              sptk::StatisticsAccumulation::Clear
                        ((StatisticsAccumulation *)in_stack_ffffffffffffdc90,buffer);
              local_cd8 = 0;
            }
            else {
              std::__cxx11::ostringstream::ostringstream(local_18a8);
              std::operator<<((ostream *)local_18a8,"Failed to write root mean squared error");
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_18c8,"rmse",&local_18c9);
              sptk::PrintErrorMessage
                        (in_stack_ffffffffffffde80,
                         (ostringstream *)
                         CONCAT17(in_stack_ffffffffffffde7f,
                                  CONCAT16(in_stack_ffffffffffffde7e,
                                           CONCAT15(in_stack_ffffffffffffde7d,
                                                    in_stack_ffffffffffffde78))));
              std::__cxx11::string::~string(local_18c8);
              std::allocator<char>::~allocator((allocator<char> *)&local_18c9);
              local_4 = 1;
              local_cd8 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_18a8);
            }
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_1700);
          std::operator<<((ostream *)local_1700,"Failed to get mean squared error");
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1720,"rmse",&local_1721);
          sptk::PrintErrorMessage
                    (in_stack_ffffffffffffde80,
                     (ostringstream *)
                     CONCAT17(in_stack_ffffffffffffde7f,
                              CONCAT16(in_stack_ffffffffffffde7e,
                                       CONCAT15(in_stack_ffffffffffffde7d,in_stack_ffffffffffffde78)
                                      )));
          std::__cxx11::string::~string(local_1720);
          std::allocator<char>::~allocator((allocator<char> *)&local_1721);
          local_4 = 1;
          local_cd8 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_1700);
        }
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdca0);
      } while (local_cd8 == 0);
LAB_0010593f:
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdca0);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdca0);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1320);
      std::operator<<((ostream *)local_1320,"Failed to initialize StatisticsAccumulation");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1340,"rmse",&local_1341);
      sptk::PrintErrorMessage
                (in_stack_ffffffffffffde80,
                 (ostringstream *)
                 CONCAT17(in_stack_ffffffffffffde7f,
                          CONCAT16(in_stack_ffffffffffffde7e,
                                   CONCAT15(in_stack_ffffffffffffde7d,in_stack_ffffffffffffde78))));
      std::__cxx11::string::~string(local_1340);
      std::allocator<char>::~allocator((allocator<char> *)&local_1341);
      local_4 = 1;
      local_cd8 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1320);
    }
    sptk::StatisticsAccumulation::Buffer::~Buffer(in_stack_ffffffffffffdc90);
    sptk::StatisticsAccumulation::Buffer::~Buffer(in_stack_ffffffffffffdc90);
    sptk::StatisticsAccumulation::~StatisticsAccumulation(&local_10a8);
  }
  else {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_ee8,(_Ios_Openmode)pcVar2);
    bVar5 = std::ios::fail();
    if ((bVar5 & 1) == 0) goto LAB_00104565;
    std::__cxx11::ostringstream::ostringstream(local_1060);
    poVar7 = std::operator<<((ostream *)local_1060,"Cannot open file ");
    std::operator<<(poVar7,local_5e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1080,"rmse",&local_1081);
    sptk::PrintErrorMessage
              (in_stack_ffffffffffffde80,
               (ostringstream *)
               CONCAT17(in_stack_ffffffffffffde7f,
                        CONCAT16(in_stack_ffffffffffffde7e,
                                 CONCAT15(in_stack_ffffffffffffde7d,in_stack_ffffffffffffde78))));
    std::__cxx11::string::~string(local_1080);
    std::allocator<char>::~allocator((allocator<char> *)&local_1081);
    local_4 = 1;
    local_cd8 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1060);
  }
  std::ifstream::~ifstream(local_ee8);
LAB_001059e7:
  std::ifstream::~ifstream(local_b38);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int vector_length(kMagicNumberForEndOfFile);
  double magic_number(0.0);
  bool use_magic_number(kDefaultUseMagicNumber);
  bool output_frame_by_frame(kDefaultOutputFrameByFrameFlag);

  const struct option long_options[] = {
      {"magic", required_argument, NULL, kMagic},
      {0, 0, 0, 0},
  };

  for (;;) {
    const int option_char(
        getopt_long_only(argc, argv, "l:m:fh", long_options, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case kMagic: {
        if (!sptk::ConvertStringToDouble(optarg, &magic_number)) {
          std::ostringstream error_message;
          error_message << "The argument for the -magic option must be numeric";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
        use_magic_number = true;
        break;
      }
      case 'f': {
        output_frame_by_frame = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* input_file1(NULL);
  const char* input_file2(NULL);
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    input_file1 = argv[argc - 2];
    input_file2 = argv[argc - 1];
  } else if (1 == num_input_files) {
    input_file1 = argv[argc - 1];
    input_file2 = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, file1, and infile, are required";
    sptk::PrintErrorMessage("rmse", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("rmse", error_message);
    return 1;
  }

  std::ifstream ifs1;
  ifs1.open(input_file1, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << input_file1;
    sptk::PrintErrorMessage("rmse", error_message);
    return 1;
  }
  std::istream& input_stream1(ifs1);

  std::ifstream ifs2;
  if (NULL != input_file2) {
    ifs2.open(input_file2, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file2;
      sptk::PrintErrorMessage("rmse", error_message);
      return 1;
    }
  }
  std::istream& input_stream2(ifs2.is_open() ? ifs2 : std::cin);

  sptk::StatisticsAccumulation accumulation(0, 1);
  sptk::StatisticsAccumulation::Buffer buffer_for_mean_squared_error;
  sptk::StatisticsAccumulation::Buffer buffer_for_mean;
  if (!accumulation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize StatisticsAccumulation";
    sptk::PrintErrorMessage("rmse", error_message);
    return 1;
  }

  const int read_size(
      kMagicNumberForEndOfFile == vector_length ? 1 : vector_length);
  std::vector<double> data1(read_size);
  std::vector<double> data2(read_size);
  while (
      sptk::ReadStream(false, 0, 0, read_size, &data1, &input_stream1, NULL) &&
      sptk::ReadStream(false, 0, 0, read_size, &data2, &input_stream2, NULL)) {
    for (int i(0); i < read_size; ++i) {
      if (!use_magic_number ||
          (magic_number != data1[i] && magic_number != data2[i])) {
        const double error(data1[i] - data2[i]);
        if (!accumulation.Run(std::vector<double>{error * error},
                              &buffer_for_mean_squared_error)) {
          std::ostringstream error_message;
          error_message << "Failed to accumulate statistics";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
      }
    }

    if (kMagicNumberForEndOfFile != vector_length) {
      std::vector<double> mean_squared_error(1);
      if (!accumulation.GetMean(buffer_for_mean_squared_error,
                                &mean_squared_error)) {
        std::ostringstream error_message;
        error_message << "Failed to get mean squared error";
        sptk::PrintErrorMessage("rmse", error_message);
        return 1;
      }

      const double root_mean_squared_error(std::sqrt(mean_squared_error[0]));
      if (output_frame_by_frame) {
        if (!sptk::WriteStream(root_mean_squared_error, &std::cout)) {
          std::ostringstream error_message;
          error_message << "Failed to write root mean squared error";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
      } else {
        if (!accumulation.Run(std::vector<double>{root_mean_squared_error},
                              &buffer_for_mean)) {
          std::ostringstream error_message;
          error_message << "Failed to accumulate statistics";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
      }
      accumulation.Clear(&buffer_for_mean_squared_error);
    }
  }

  if (kMagicNumberForEndOfFile == vector_length) {
    std::vector<double> mean_squared_error(1);
    if (!accumulation.GetMean(buffer_for_mean_squared_error,
                              &mean_squared_error)) {
      std::ostringstream error_message;
      error_message << "Failed to get mean squared error";
      sptk::PrintErrorMessage("rmse", error_message);
      return 1;
    }

    const double root_mean_squared_error(std::sqrt(mean_squared_error[0]));
    if (!sptk::WriteStream(root_mean_squared_error, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write root mean squared error";
      sptk::PrintErrorMessage("rmse", error_message);
      return 1;
    }
  } else if (!output_frame_by_frame) {
    std::vector<double> mean(1);
    if (!accumulation.GetMean(buffer_for_mean, &mean)) {
      std::ostringstream error_message;
      error_message << "Failed to get root mean squared error";
      sptk::PrintErrorMessage("rmse", error_message);
      return 1;
    }

    if (!sptk::WriteStream(mean[0], &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write root mean squared error";
      sptk::PrintErrorMessage("rmse", error_message);
      return 1;
    }
  }

  return 0;
}